

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_div(DisasContext_conflict1 *s,_Bool is_signed,uint sf,uint rm,uint rn,uint rd)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 pTVar1;
  code *func;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = cpu_reg_aarch64(s,rd);
  if (sf == 0) {
    if (is_signed) {
      ret_00 = new_tmp_a64_aarch64(s);
      ret_01 = new_tmp_a64_aarch64(s);
      pTVar1 = cpu_reg_aarch64(s,rn);
      tcg_gen_ext32s_i64_aarch64(tcg_ctx,ret_00,pTVar1);
      pTVar1 = cpu_reg_aarch64(s,rm);
      tcg_gen_ext32s_i64_aarch64(tcg_ctx,ret_01,pTVar1);
      goto LAB_006a2b48;
    }
    ret_00 = read_cpu_reg_aarch64(s,rn,0);
    ret_01 = read_cpu_reg_aarch64(s,rm,0);
  }
  else {
    ret_00 = read_cpu_reg_aarch64(s,rn,sf);
    ret_01 = read_cpu_reg_aarch64(s,rm,sf);
    if (is_signed) {
LAB_006a2b48:
      func = helper_sdiv64_aarch64;
      goto LAB_006a2bab;
    }
  }
  func = helper_udiv64_aarch64;
LAB_006a2bab:
  local_40 = ret_01 + (long)tcg_ctx;
  local_48 = (TCGTemp *)(ret_00 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(ret + (long)&tcg_ctx->pool_cur),2,&local_48);
  if (sf == 0) {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,ret);
  }
  return;
}

Assistant:

static void handle_div(DisasContext *s, bool is_signed, unsigned int sf,
                       unsigned int rm, unsigned int rn, unsigned int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_n, tcg_m, tcg_rd;
    tcg_rd = cpu_reg(s, rd);

    if (!sf && is_signed) {
        tcg_n = new_tmp_a64(s);
        tcg_m = new_tmp_a64(s);
        tcg_gen_ext32s_i64(tcg_ctx, tcg_n, cpu_reg(s, rn));
        tcg_gen_ext32s_i64(tcg_ctx, tcg_m, cpu_reg(s, rm));
    } else {
        tcg_n = read_cpu_reg(s, rn, sf);
        tcg_m = read_cpu_reg(s, rm, sf);
    }

    if (is_signed) {
        gen_helper_sdiv64(tcg_ctx, tcg_rd, tcg_n, tcg_m);
    } else {
        gen_helper_udiv64(tcg_ctx, tcg_rd, tcg_n, tcg_m);
    }

    if (!sf) { /* zero extend final result */
        tcg_gen_ext32u_i64(tcg_ctx, tcg_rd, tcg_rd);
    }
}